

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_strfmt.c
# Opt level: O0

char * lj_strfmt_pushvf(lua_State *L,char *fmt,__va_list_tag *argp)

{
  uint32_t uVar1;
  uint uVar2;
  uint32_t uVar3;
  SFormat SVar4;
  size_t sVar5;
  GCstr *pGVar6;
  ulong uVar7;
  SBuf *in_RDX;
  char *in_RSI;
  long in_RDI;
  char *s;
  GCstr *str;
  SFormat sf;
  FormatState fs;
  SBuf *sb;
  SBuf *sb_1;
  char *p_1;
  char *p;
  undefined4 in_stack_fffffffffffffda8;
  SFormat in_stack_fffffffffffffdac;
  SBuf *in_stack_fffffffffffffdb0;
  lua_State *in_stack_fffffffffffffdb8;
  SBuf *in_stack_fffffffffffffdc0;
  undefined4 *local_230;
  char *in_stack_fffffffffffffdf8;
  long *in_stack_fffffffffffffe00;
  SFormat sf_00;
  SBuf *in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe10;
  uint in_stack_fffffffffffffe14;
  char *in_stack_fffffffffffffe18;
  lua_State *in_stack_fffffffffffffe20;
  char *local_160;
  FormatState local_148;
  lua_State *local_128;
  SBuf *local_120;
  long local_110;
  lua_State *local_108;
  char *local_f8;
  undefined4 local_ec;
  lua_State *local_e8;
  undefined4 local_dc;
  lua_State *local_d8;
  char *local_d0;
  char *local_c8;
  undefined4 local_bc;
  lua_State *local_b8;
  undefined4 local_ac;
  lua_State *local_a8;
  char *local_a0;
  undefined4 local_94;
  FormatState *local_88;
  lua_State *local_80;
  long local_78;
  GCstr *local_70;
  undefined4 *local_68;
  long local_60;
  lua_State *local_58;
  undefined4 local_4c;
  GCstr *local_48;
  undefined4 *local_40;
  long local_38;
  undefined4 local_2c;
  GCstr *local_28;
  undefined4 *local_20;
  char *local_18;
  undefined4 *local_10;
  long local_8;
  
  uVar7 = (ulong)*(uint *)(in_RDI + 8);
  local_128 = (lua_State *)(uVar7 + 0xe8);
  *(int *)(uVar7 + 0xf4) = (int)in_RDI;
  (local_128->nextgc).gcptr32 = *(uint32_t *)(uVar7 + 0xf0);
  local_120 = in_RDX;
  local_110 = in_RDI;
  local_108 = local_128;
  local_58 = local_128;
  sVar5 = strlen(in_RSI);
  local_88 = &local_148;
  local_94 = (undefined4)sVar5;
  local_148.e = (uint8_t *)(in_RSI + (sVar5 & 0xffffffff));
  do {
    SVar4 = lj_strfmt_parse(&local_148);
    if (SVar4 == 0) {
      local_78 = local_110;
      local_80 = local_128;
      pGVar6 = lj_str_new(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                          CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
      local_68 = *(undefined4 **)(local_110 + 0x18);
      local_60 = local_110;
      local_38 = local_110;
      local_4c = 0xfffffffb;
      local_2c = 0xfffffffb;
      *local_68 = (int)pGVar6;
      local_68[1] = 0xfffffffb;
      local_8 = local_110;
      local_18 = "store to dead GC object";
      uVar7 = *(long *)(local_110 + 0x18) + 8;
      *(ulong *)(local_110 + 0x18) = uVar7;
      if (*(uint *)(local_110 + 0x20) <= uVar7) {
        local_70 = pGVar6;
        local_48 = pGVar6;
        local_40 = local_68;
        local_28 = pGVar6;
        local_20 = local_68;
        local_10 = local_68;
        lj_state_growstack1((lua_State *)0x121635);
      }
      return (char *)(pGVar6 + 1);
    }
    sf_00 = (SFormat)((ulong)in_stack_fffffffffffffe00 >> 0x20);
    switch(SVar4 & 0xf) {
    case 1:
    default:
      local_e8 = local_128;
      local_ec = 0x3f;
      local_d8 = local_128;
      local_dc = 1;
      uVar3._0_1_ = local_128->marked;
      uVar3._1_1_ = local_128->gct;
      uVar3._2_1_ = local_128->dummy_ffid;
      uVar3._3_1_ = local_128->status;
      if (uVar3 == (local_128->nextgc).gcptr32) {
        local_d0 = lj_buf_more2(in_stack_fffffffffffffdb0,in_stack_fffffffffffffdac);
      }
      else {
        local_d0 = (char *)(ulong)(local_128->nextgc).gcptr32;
      }
      local_f8 = local_d0 + 1;
      *local_d0 = (char)local_ec;
      (local_e8->nextgc).gcptr32 = (uint32_t)local_f8;
      break;
    case 2:
      lj_buf_putmem(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
                    (MSize)((ulong)in_stack_fffffffffffffdb0 >> 0x20));
      break;
    case 3:
      uVar2 = (local_120->p).ptr32;
      if (uVar2 < 0x29) {
        (local_120->p).ptr32 = uVar2 + 8;
      }
      else {
        *(long *)&local_120->b = *(long *)&local_120->b + 8;
      }
      lj_strfmt_putfxint(in_stack_fffffffffffffe08,sf_00,(uint64_t)in_stack_fffffffffffffdf8);
      break;
    case 4:
      uVar2 = (local_120->p).ptr32;
      if (uVar2 < 0x29) {
        (local_120->p).ptr32 = uVar2 + 8;
      }
      else {
        *(long *)&local_120->b = *(long *)&local_120->b + 8;
      }
      lj_strfmt_putfxint(in_stack_fffffffffffffe08,sf_00,(uint64_t)in_stack_fffffffffffffdf8);
      break;
    case 5:
      uVar2 = (local_120->e).ptr32;
      if (uVar2 < 0xa1) {
        in_stack_fffffffffffffe18 = (char *)((long)(int)uVar2 + *(long *)(local_120 + 1));
        (local_120->e).ptr32 = uVar2 + 0x10;
      }
      else {
        in_stack_fffffffffffffe18 = *(char **)&local_120->b;
        *(char **)&local_120->b = in_stack_fffffffffffffe18 + 8;
      }
      in_stack_fffffffffffffe20 = local_128;
      lj_strfmt_putfnum(in_stack_fffffffffffffdb0,in_stack_fffffffffffffdac,5.8502906002837e-318);
      break;
    case 6:
      in_stack_fffffffffffffe14 = (local_120->p).ptr32;
      if (in_stack_fffffffffffffe14 < 0x29) {
        in_stack_fffffffffffffe00 =
             (long *)((long)(int)in_stack_fffffffffffffe14 + *(long *)(local_120 + 1));
        (local_120->p).ptr32 = in_stack_fffffffffffffe14 + 8;
      }
      else {
        in_stack_fffffffffffffe00 = *(long **)&local_120->b;
        *(long **)&local_120->b = in_stack_fffffffffffffe00 + 1;
      }
      local_160 = (char *)*in_stack_fffffffffffffe00;
      if (local_160 == (char *)0x0) {
        local_160 = "(null)";
      }
      in_stack_fffffffffffffe08 = local_120;
      strlen(local_160);
      lj_buf_putmem(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
                    (MSize)((ulong)in_stack_fffffffffffffdb0 >> 0x20));
      in_stack_fffffffffffffdf8 = local_160;
      break;
    case 7:
      uVar2 = (local_120->p).ptr32;
      if (uVar2 < 0x29) {
        local_230 = (undefined4 *)((long)(int)uVar2 + *(long *)(local_120 + 1));
        (local_120->p).ptr32 = uVar2 + 8;
      }
      else {
        local_230 = *(undefined4 **)&local_120->b;
        *(undefined4 **)&local_120->b = local_230 + 2;
      }
      local_bc = *local_230;
      local_b8 = local_128;
      local_a8 = local_128;
      local_ac = 1;
      uVar1._0_1_ = local_128->marked;
      uVar1._1_1_ = local_128->gct;
      uVar1._2_1_ = local_128->dummy_ffid;
      uVar1._3_1_ = local_128->status;
      if (uVar1 == (local_128->nextgc).gcptr32) {
        local_a0 = lj_buf_more2(in_stack_fffffffffffffdb0,in_stack_fffffffffffffdac);
      }
      else {
        local_a0 = (char *)(ulong)(local_128->nextgc).gcptr32;
      }
      local_c8 = local_a0 + 1;
      *local_a0 = (char)local_bc;
      (local_b8->nextgc).gcptr32 = (uint32_t)local_c8;
      break;
    case 8:
      uVar2 = (local_120->p).ptr32;
      if (uVar2 < 0x29) {
        in_stack_fffffffffffffdb0 = (SBuf *)((long)(int)uVar2 + *(long *)(local_120 + 1));
        (local_120->p).ptr32 = uVar2 + 8;
      }
      else {
        in_stack_fffffffffffffdb0 = *(SBuf **)&local_120->b;
        *(MRef **)&local_120->b = &in_stack_fffffffffffffdb0->b;
      }
      in_stack_fffffffffffffdb8 = local_128;
      in_stack_fffffffffffffdc0 = local_120;
      lj_strfmt_putptr((SBuf *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
                       (void *)0x1213ca);
    }
  } while( true );
}

Assistant:

const char *lj_strfmt_pushvf(lua_State *L, const char *fmt, va_list argp)
{
  SBuf *sb = lj_buf_tmp_(L);
  FormatState fs;
  SFormat sf;
  GCstr *str;
  lj_strfmt_init(&fs, fmt, (MSize)strlen(fmt));
  while ((sf = lj_strfmt_parse(&fs)) != STRFMT_EOF) {
    switch (STRFMT_TYPE(sf)) {
    case STRFMT_LIT:
      lj_buf_putmem(sb, fs.str, fs.len);
      break;
    case STRFMT_INT:
      lj_strfmt_putfxint(sb, sf, va_arg(argp, int32_t));
      break;
    case STRFMT_UINT:
      lj_strfmt_putfxint(sb, sf, va_arg(argp, uint32_t));
      break;
    case STRFMT_NUM:
      lj_strfmt_putfnum(sb, STRFMT_G14, va_arg(argp, lua_Number));
      break;
    case STRFMT_STR: {
      const char *s = va_arg(argp, char *);
      if (s == NULL) s = "(null)";
      lj_buf_putmem(sb, s, (MSize)strlen(s));
      break;
      }
    case STRFMT_CHAR:
      lj_buf_putb(sb, va_arg(argp, int));
      break;
    case STRFMT_PTR:
      lj_strfmt_putptr(sb, va_arg(argp, void *));
      break;
    case STRFMT_ERR:
    default:
      lj_buf_putb(sb, '?');
      lj_assertL(0, "bad string format near offset %d", fs.len);
      break;
    }
  }
  str = lj_buf_str(L, sb);
  setstrV(L, L->top, str);
  incr_top(L);
  return strdata(str);
}